

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O3

void bonk_free(t_bonk *x)

{
  int *piVar1;
  t_filterbank *fatso;
  void *fatso_00;
  t_filterbank *ptVar2;
  t_filterbank *ptVar3;
  t_filterbank **pptVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  t_float **pptVar8;
  long lVar9;
  
  iVar5 = x->x_ninsig;
  lVar7 = (long)iVar5;
  if (0 < lVar7) {
    pptVar8 = &x->x_insig->g_inbuf;
    do {
      freebytes(*pptVar8,(long)x->x_npoints << 2);
      pptVar8 = pptVar8 + 0x4b3;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  freebytes(x->x_insig,lVar7 * 0x2598);
  clock_free(x->x_clock);
  fatso = x->x_filterbank;
  piVar1 = &fatso->b_refcount;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    ptVar3 = bonk_filterbanklist;
    if (bonk_filterbanklist == fatso) {
      pptVar4 = &bonk_filterbanklist;
      ptVar3 = fatso;
    }
    else {
      do {
        ptVar2 = ptVar3;
        ptVar3 = ptVar2->b_next;
        if (ptVar3 == (t_filterbank *)0x0) goto LAB_001a9f99;
      } while (ptVar3 != fatso);
      pptVar4 = &ptVar2->b_next;
    }
    *pptVar4 = ptVar3->b_next;
LAB_001a9f99:
    iVar5 = fatso->b_nfilters;
    lVar7 = (long)iVar5;
    if (0 < lVar7) {
      lVar9 = 0;
      lVar6 = 0;
      do {
        fatso_00 = *(void **)((long)&fatso->b_vec->k_stuff + lVar9);
        if (fatso_00 != (void *)0x0) {
          freebytes(fatso_00,(long)*(int *)((long)&fatso->b_vec->k_filterpoints + lVar9) << 2);
          iVar5 = fatso->b_nfilters;
        }
        lVar6 = lVar6 + 1;
        lVar7 = (long)iVar5;
        lVar9 = lVar9 + 0x20;
      } while (lVar6 < lVar7);
    }
    freebytes(fatso->b_vec,lVar7 << 5);
    freebytes(fatso,0x30);
  }
  freebytes(x->x_template,(long)x->x_ntemplate * 800);
  return;
}

Assistant:

static void bonk_free(t_bonk *x)
{
    
    int i, ninsig = x->x_ninsig;
    t_insig *gp = x->x_insig;
#ifdef MSP
    dsp_free((t_pxobject *)x);
#endif
    for (i = 0, gp = x->x_insig; i < ninsig; i++, gp++)
        freebytes(gp->g_inbuf, x->x_npoints * sizeof(t_float));
    freebytes(x->x_insig, ninsig * sizeof(*x->x_insig));
    clock_free(x->x_clock);
    if (!--(x->x_filterbank->b_refcount))
        bonk_freefilterbank(x->x_filterbank);
    freebytes(x->x_template, x->x_ntemplate * sizeof(x->x_template[0]));
}